

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void new_mem_loc(gen_ctx_t gen_ctx,MIR_op_t *mem_op_ref,int flag)

{
  undefined1 uVar1;
  mem_attr_t obj;
  mem_attr_t obj_00;
  size_t sVar2;
  bool bVar3;
  char *local_58;
  undefined2 uStack_46;
  mem_attr_t mem_attr;
  int64_t disp;
  int flag_local;
  MIR_op_t *mem_op_ref_local;
  gen_ctx_t gen_ctx_local;
  
  sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
  (mem_op_ref->u).mem.nloc = (uint32_t)sVar2;
  if ((uint32_t)sVar2 == 0) {
    (mem_op_ref->u).mem.nloc = 1;
  }
  uVar1 = *(undefined1 *)&mem_op_ref->u;
  mem_attr._0_4_ = *(undefined4 *)((long)&mem_op_ref->u + 4);
  mem_attr.type = (mem_op_ref->u).mem.nonalias;
  mem_attr.def_insn = (MIR_insn_t)0x0;
  mem_attr.alias = 0;
  mem_attr.nonalias = 0;
  bVar3 = (flag & 2U) != 0;
  if (bVar3) {
    mem_attr._8_8_ = get_def_disp((ssa_edge_t_conflict)mem_op_ref->data,&mem_attr.disp);
    mem_attr.def_insn = (MIR_insn_t)mem_attr.disp;
  }
  sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
  if (sVar2 == 0) {
    obj.disp_def_p = bVar3;
    obj.alloca_flag = (char)flag;
    obj._2_2_ = uStack_46;
    obj.type._0_1_ = uVar1;
    obj.type._1_3_ = 0;
    obj.nonalias = mem_attr.type;
    obj.alias._0_1_ = mem_attr.alloca_flag;
    obj.alias._1_1_ = mem_attr.disp_def_p;
    obj.alias._2_2_ = mem_attr._2_2_;
    obj.def_insn = (MIR_insn_t)mem_attr._8_8_;
    obj.disp = (int64_t)mem_attr.def_insn;
    VARR_mem_attr_tpush(gen_ctx->mem_attrs,obj);
  }
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"    new m%lu",(ulong)(mem_op_ref->u).mem.nloc);
    if (mem_attr._8_8_ != 0) {
      fprintf((FILE *)gen_ctx->debug_file,"(def_insn=%u)",
              (ulong)*(uint *)(*(long *)mem_attr._8_8_ + 0xc));
    }
    if (bVar3) {
      fprintf((FILE *)gen_ctx->debug_file,"(disp=%lld)",mem_attr.def_insn);
    }
    if (flag != 0) {
      if ((flag & 3U) == 0) {
        local_58 = "must";
        if ((flag & 1U) != 0) {
          local_58 = "may";
        }
      }
      else {
        local_58 = "may/must";
      }
      fprintf((FILE *)gen_ctx->debug_file," is %s alloca based",local_58);
    }
    fprintf((FILE *)gen_ctx->debug_file,"\n");
  }
  obj_00.disp_def_p = bVar3;
  obj_00.alloca_flag = (char)flag;
  obj_00._2_2_ = uStack_46;
  obj_00.type._0_1_ = uVar1;
  obj_00.type._1_3_ = 0;
  obj_00.nonalias = mem_attr.type;
  obj_00.alias._0_1_ = mem_attr.alloca_flag;
  obj_00.alias._1_1_ = mem_attr.disp_def_p;
  obj_00.alias._2_2_ = mem_attr._2_2_;
  obj_00.def_insn = (MIR_insn_t)mem_attr._8_8_;
  obj_00.disp = (int64_t)mem_attr.def_insn;
  VARR_mem_attr_tpush(gen_ctx->mem_attrs,obj_00);
  return;
}

Assistant:

static void new_mem_loc (gen_ctx_t gen_ctx, MIR_op_t *mem_op_ref, int flag) {
  /* zero loc is fixed: */
  int64_t disp;
  mem_attr_t mem_attr;

  if ((mem_op_ref->u.var_mem.nloc = (uint32_t) VARR_LENGTH (mem_attr_t, mem_attrs)) == 0)
    mem_op_ref->u.var_mem.nloc = 1;
  mem_attr.alloca_flag = flag;
  mem_attr.type = mem_op_ref->u.var_mem.type;
  mem_attr.alias = mem_op_ref->u.var_mem.alias;
  mem_attr.nonalias = mem_op_ref->u.var_mem.nonalias;
  mem_attr.disp_def_p = FALSE;
  mem_attr.disp = 0;
  mem_attr.def_insn = NULL;
  if ((flag & MUST_ALLOCA) != 0) {
    mem_attr.def_insn = get_def_disp (mem_op_ref->data, &disp);
    mem_attr.disp_def_p = TRUE;
    mem_attr.disp = disp;
  }
  if (VARR_LENGTH (mem_attr_t, mem_attrs) == 0) VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
  DEBUG (2, {
    fprintf (debug_file, "    new m%lu", (unsigned long) mem_op_ref->u.var_mem.nloc);
    if (mem_attr.def_insn != NULL)
      fprintf (debug_file, "(def_insn=%u)", ((bb_insn_t) mem_attr.def_insn->data)->index);
    if (mem_attr.disp_def_p) fprintf (debug_file, "(disp=%lld)", (long long) mem_attr.disp);
    if (flag)
      fprintf (debug_file, " is %s alloca based",
               flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
               : flag & MAY_ALLOCA               ? "may"
                                                 : "must");
    fprintf (debug_file, "\n");
  });
  VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
}